

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O2

void __thiscall t_st_generator::generate_const(t_st_generator *this,t_const *tconst)

{
  t_type *type;
  t_const_value *value;
  ostream *poVar1;
  string name;
  string local_a0;
  string local_80;
  string local_60;
  string local_40 [32];
  
  type = tconst->type_;
  std::__cxx11::string::string(local_40,(string *)&tconst->name_);
  value = tconst->value_;
  class_name_abi_cxx11_(&local_80,this);
  prefix(&local_60,this,&local_80);
  poVar1 = std::operator<<((ostream *)&this->f_,(string *)&local_60);
  poVar1 = std::operator<<(poVar1," constants at: \'");
  poVar1 = std::operator<<(poVar1,local_40);
  poVar1 = std::operator<<(poVar1,"\' put: [");
  render_const_value_abi_cxx11_(&local_a0,this,type,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_a0);
  poVar1 = std::operator<<(poVar1,"]!");
  poVar1 = std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void t_st_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_ << prefix(class_name()) << " constants at: '" << name << "' put: ["
     << render_const_value(type, value) << "]!" << endl << endl;
}